

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

bool __thiscall Assimp::MD3Importer::ReadMultipartFile(MD3Importer *this)

{
  string *psVar1;
  aiMetadata *paVar2;
  pointer pcVar3;
  aiNode *paVar4;
  bool bVar5;
  int iVar6;
  uint which;
  uint which_00;
  uint which_01;
  long *plVar7;
  Logger *pLVar8;
  aiNode *paVar9;
  aiScene *this_00;
  aiScene *paVar10;
  aiScene *this_01;
  runtime_error *this_02;
  aiMetadata *paVar11;
  size_type *psVar12;
  bool bVar13;
  char *pcVar14;
  BatchLoader batch;
  string failure;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> attach;
  string head;
  string upper;
  string lower;
  string suffix;
  string mod_filename;
  PropertyMap props;
  BatchLoader local_200;
  undefined1 *local_1f8;
  aiLight **local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> local_1d8;
  string local_1b8;
  string local_198;
  aiScene *local_178;
  AttachmentInfo local_170;
  undefined1 local_160 [16];
  string local_150;
  long *local_130 [2];
  long local_120 [2];
  long *local_110;
  aiLight **local_108;
  long local_100 [2];
  undefined1 local_f0 [8];
  undefined1 local_e8 [16];
  _Base_ptr p_Stack_d8;
  _Base_ptr local_d0;
  size_t local_c8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  local_c0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
  local_60;
  
  psVar1 = &this->filename;
  std::__cxx11::string::rfind((char)psVar1,0x5f);
  std::__cxx11::string::rfind((char)psVar1,0x2e);
  std::__cxx11::string::substr((ulong)&local_110,(ulong)psVar1);
  std::__cxx11::string::substr((ulong)local_130,(ulong)psVar1);
  iVar6 = std::__cxx11::string::compare((char *)&local_110);
  if (((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&local_110), iVar6 == 0)) ||
     (iVar6 = std::__cxx11::string::compare((char *)&local_110), iVar6 == 0)) {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    pcVar3 = (this->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar3,pcVar3 + (this->path)._M_string_length);
    pcVar14 = "lower";
    std::__cxx11::string::append((char *)&local_198);
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_130[0]);
    paVar2 = (aiMetadata *)(local_e8 + 8);
    paVar11 = (aiMetadata *)(plVar7 + 2);
    if ((aiMetadata *)*plVar7 == paVar11) {
      local_e8._8_8_ = *(undefined8 *)paVar11;
      p_Stack_d8 = (_Base_ptr)plVar7[3];
      local_f0 = (undefined1  [8])paVar2;
    }
    else {
      local_e8._8_8_ = *(undefined8 *)paVar11;
      local_f0 = (undefined1  [8])*plVar7;
    }
    local_e8._0_8_ = plVar7[1];
    *plVar7 = (long)paVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_f0);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_150.field_2._M_allocated_capacity = *psVar12;
      local_150.field_2._8_8_ = plVar7[3];
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar12;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_f0 != (undefined1  [8])paVar2) {
      operator_delete((void *)local_f0,(ulong)((long)(_Rb_tree_color *)local_e8._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    pcVar3 = (this->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar3,pcVar3 + (this->path)._M_string_length);
    std::__cxx11::string::append((char *)&local_1b8);
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_130[0]);
    paVar11 = (aiMetadata *)(plVar7 + 2);
    if ((aiMetadata *)*plVar7 == paVar11) {
      local_e8._8_8_ = *(undefined8 *)paVar11;
      p_Stack_d8 = (_Base_ptr)plVar7[3];
      local_f0 = (undefined1  [8])paVar2;
    }
    else {
      local_e8._8_8_ = *(undefined8 *)paVar11;
      local_f0 = (undefined1  [8])*plVar7;
    }
    local_e8._0_8_ = plVar7[1];
    *plVar7 = (long)paVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_f0);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_198.field_2._M_allocated_capacity = *psVar12;
      local_198.field_2._8_8_ = plVar7[3];
    }
    else {
      local_198.field_2._M_allocated_capacity = *psVar12;
      local_198._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_198._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_f0 != (undefined1  [8])paVar2) {
      operator_delete((void *)local_f0,(ulong)((long)(_Rb_tree_color *)local_e8._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    local_1f8 = &local_1e8;
    pcVar3 = (this->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar3,pcVar3 + (this->path)._M_string_length);
    std::__cxx11::string::append((char *)&local_1f8);
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_130[0]);
    paVar11 = (aiMetadata *)(plVar7 + 2);
    if ((aiMetadata *)*plVar7 == paVar11) {
      local_e8._8_8_ = *(undefined8 *)paVar11;
      p_Stack_d8 = (_Base_ptr)plVar7[3];
      local_f0 = (undefined1  [8])paVar2;
    }
    else {
      local_e8._8_8_ = *(undefined8 *)paVar11;
      local_f0 = (undefined1  [8])*plVar7;
    }
    local_e8._0_8_ = plVar7[1];
    *plVar7 = (long)paVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_f0);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1b8.field_2._M_allocated_capacity = *psVar12;
      local_1b8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar12;
      local_1b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1b8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_f0 != (undefined1  [8])paVar2) {
      operator_delete((void *)local_f0,(ulong)((long)(_Rb_tree_color *)local_e8._8_8_ + 1));
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
    }
    local_1f8 = &local_1e8;
    local_1f0 = (aiLight **)0x0;
    local_1e8 = 0;
    local_1d8.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (AttachmentInfo *)0x0;
    local_1d8.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (AttachmentInfo *)0x0;
    pLVar8 = DefaultLogger::get();
    Logger::info(pLVar8,"Multi part MD3 player model: lower, upper and head parts are joined");
    p_Stack_d8 = (_Base_ptr)local_e8;
    local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
    local_e8._8_8_ = (_Base_ptr)0x0;
    local_c8 = 0;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c0._M_impl.super__Rb_tree_header._M_header;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_170.scene = (aiScene *)((ulong)local_170.scene._4_4_ << 0x20);
    local_d0 = p_Stack_d8;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    SetGenericProperty<int>
              ((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *)local_f0,"IMPORT_MD3_HANDLE_MULTIPART",(int *)&local_170);
    BatchLoader::BatchLoader(&local_200,this->mIOHandler,false);
    which = BatchLoader::AddLoadRequest(&local_200,&local_150,0,(PropertyMap *)local_f0);
    which_00 = BatchLoader::AddLoadRequest(&local_200,&local_198,0,(PropertyMap *)local_f0);
    which_01 = BatchLoader::AddLoadRequest(&local_200,&local_1b8,0,(PropertyMap *)local_f0);
    BatchLoader::LoadAll(&local_200);
    local_178 = (aiScene *)operator_new(0x80);
    aiScene::aiScene(local_178);
    paVar9 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar9);
    local_178->mRootNode = paVar9;
    (paVar9->mName).length = 0xc;
    builtin_strncpy((paVar9->mName).data,"<MD3_Player>",0xd);
    this_00 = BatchLoader::GetImport(&local_200,which);
    if (this_00 == (aiScene *)0x0) {
      pLVar8 = DefaultLogger::get();
      Logger::error(pLVar8,"M3D: Failed to read multi part model, lower.md3 fails to load");
LAB_0045f1be:
      this_01 = (aiScene *)0x0;
      std::__cxx11::string::_M_replace((ulong)&local_1f8,0,(char *)local_1f0,(ulong)pcVar14);
      paVar10 = (aiScene *)0x0;
LAB_0045f1dd:
      if (paVar10 != (aiScene *)0x0) {
        aiScene::~aiScene(paVar10);
        operator_delete(paVar10,0x80);
      }
      paVar10 = local_178;
      if (this_00 != (aiScene *)0x0) {
        aiScene::~aiScene(this_00);
        operator_delete(this_00,0x80);
      }
      if (this_01 != (aiScene *)0x0) {
        aiScene::~aiScene(this_01);
        operator_delete(this_01,0x80);
      }
      aiScene::~aiScene(paVar10);
      operator_delete(paVar10,0x80);
      bVar5 = true;
      if ((local_1f0 == local_108) &&
         ((local_1f0 == (aiLight **)0x0 ||
          (iVar6 = bcmp(local_1f8,local_110,(size_t)local_1f0), iVar6 == 0)))) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_170.scene = (aiScene *)local_160;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,"MD3: failure to read multipart host file","");
        std::runtime_error::runtime_error(this_02,(string *)&local_170);
        *(undefined ***)this_02 = &PTR__runtime_error_007fa260;
        __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      paVar10 = BatchLoader::GetImport(&local_200,which_00);
      if (paVar10 == (aiScene *)0x0) {
        pLVar8 = DefaultLogger::get();
        Logger::error(pLVar8,"M3D: Failed to read multi part model, upper.md3 fails to load");
        pcVar14 = "upper";
        goto LAB_0045f1be;
      }
      this_01 = BatchLoader::GetImport(&local_200,which_01);
      if (this_01 == (aiScene *)0x0) {
        pLVar8 = DefaultLogger::get();
        Logger::error(pLVar8,"M3D: Failed to read multi part model, head.md3 fails to load");
        this_01 = (aiScene *)0x0;
        std::__cxx11::string::_M_replace((ulong)&local_1f8,0,(char *)local_1f0,0x6b8e82);
        goto LAB_0045f1dd;
      }
      paVar4 = this_00->mRootNode;
      (paVar4->mName).length = 5;
      builtin_strncpy((paVar4->mName).data,"lower",6);
      local_170.scene = this_00;
      local_170.attachToNode = paVar9;
      if (local_1d8.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_1d8.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
        _M_realloc_insert<Assimp::AttachmentInfo>
                  (&local_1d8,
                   (iterator)
                   local_1d8.
                   super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_170);
      }
      else {
        (local_1d8.
         super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl
         .super__Vector_impl_data._M_finish)->scene = this_00;
        (local_1d8.
         super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl
         .super__Vector_impl_data._M_finish)->attachToNode = paVar9;
        local_1d8.
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1d8.
             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      paVar9 = aiNode::FindNode(this_00->mRootNode,"tag_torso");
      if (paVar9 == (aiNode *)0x0) {
        pLVar8 = DefaultLogger::get();
        pcVar14 = "M3D: Failed to find attachment tag for multi part model: tag_torso expected";
LAB_0045f4dc:
        Logger::error(pLVar8,pcVar14);
        goto LAB_0045f1dd;
      }
      paVar4 = paVar10->mRootNode;
      (paVar4->mName).length = 5;
      builtin_strncpy((paVar4->mName).data,"upper",6);
      local_170.scene = paVar10;
      local_170.attachToNode = paVar9;
      if (local_1d8.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_1d8.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
        _M_realloc_insert<Assimp::AttachmentInfo>
                  (&local_1d8,
                   (iterator)
                   local_1d8.
                   super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_170);
      }
      else {
        (local_1d8.
         super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl
         .super__Vector_impl_data._M_finish)->scene = paVar10;
        (local_1d8.
         super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl
         .super__Vector_impl_data._M_finish)->attachToNode = paVar9;
        local_1d8.
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1d8.
             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      paVar9 = aiNode::FindNode(paVar10->mRootNode,"tag_head");
      if (paVar9 == (aiNode *)0x0) {
        pLVar8 = DefaultLogger::get();
        pcVar14 = "M3D: Failed to find attachment tag for multi part model: tag_head expected";
        goto LAB_0045f4dc;
      }
      paVar4 = this_01->mRootNode;
      (paVar4->mName).length = 4;
      builtin_strncpy((paVar4->mName).data,"head",5);
      local_170.scene = this_01;
      local_170.attachToNode = paVar9;
      if (local_1d8.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_1d8.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
        _M_realloc_insert<Assimp::AttachmentInfo>
                  (&local_1d8,
                   (iterator)
                   local_1d8.
                   super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_170);
      }
      else {
        (local_1d8.
         super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl
         .super__Vector_impl_data._M_finish)->scene = this_01;
        (local_1d8.
         super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl
         .super__Vector_impl_data._M_finish)->attachToNode = paVar9;
        local_1d8.
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1d8.
             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      paVar9 = aiNode::FindNode(paVar10->mRootNode,"tag_torso");
      RemoveSingleNodeFromList(paVar9);
      paVar9 = aiNode::FindNode(this_01->mRootNode,"tag_head");
      RemoveSingleNodeFromList(paVar9);
      paVar9 = this_01->mRootNode;
      (paVar9->mTransformation).a1 = 1.0;
      (paVar9->mTransformation).a2 = 0.0;
      (paVar9->mTransformation).a3 = 0.0;
      (paVar9->mTransformation).a4 = 0.0;
      (paVar9->mTransformation).b1 = 0.0;
      (paVar9->mTransformation).b2 = 1.0;
      (paVar9->mTransformation).b3 = 0.0;
      (paVar9->mTransformation).b4 = 0.0;
      (paVar9->mTransformation).c1 = 0.0;
      (paVar9->mTransformation).c2 = 0.0;
      (paVar9->mTransformation).c3 = 1.0;
      (paVar9->mTransformation).c4 = 0.0;
      (paVar9->mTransformation).d1 = 0.0;
      (paVar9->mTransformation).d2 = 0.0;
      (paVar9->mTransformation).d3 = 0.0;
      (paVar9->mTransformation).d4 = 1.0;
      paVar9 = this_00->mRootNode;
      (paVar9->mTransformation).a1 = 1.0;
      (paVar9->mTransformation).a2 = 0.0;
      (paVar9->mTransformation).a3 = 0.0;
      (paVar9->mTransformation).a4 = 0.0;
      (paVar9->mTransformation).b1 = 0.0;
      (paVar9->mTransformation).b2 = 1.0;
      (paVar9->mTransformation).b3 = 0.0;
      (paVar9->mTransformation).b4 = 0.0;
      (paVar9->mTransformation).c1 = 0.0;
      (paVar9->mTransformation).c2 = 0.0;
      (paVar9->mTransformation).c3 = 1.0;
      (paVar9->mTransformation).c4 = 0.0;
      (paVar9->mTransformation).d1 = 0.0;
      (paVar9->mTransformation).d2 = 0.0;
      (paVar9->mTransformation).d3 = 0.0;
      (paVar9->mTransformation).d4 = 1.0;
      paVar9 = paVar10->mRootNode;
      (paVar9->mTransformation).a1 = 1.0;
      (paVar9->mTransformation).a2 = 0.0;
      (paVar9->mTransformation).a3 = 0.0;
      (paVar9->mTransformation).a4 = 0.0;
      (paVar9->mTransformation).b1 = 0.0;
      (paVar9->mTransformation).b2 = 1.0;
      (paVar9->mTransformation).b3 = 0.0;
      (paVar9->mTransformation).b4 = 0.0;
      (paVar9->mTransformation).c1 = 0.0;
      (paVar9->mTransformation).c2 = 0.0;
      (paVar9->mTransformation).c3 = 1.0;
      (paVar9->mTransformation).c4 = 0.0;
      (paVar9->mTransformation).d1 = 0.0;
      (paVar9->mTransformation).d2 = 0.0;
      (paVar9->mTransformation).d3 = 0.0;
      (paVar9->mTransformation).d4 = 1.0;
      SceneCombiner::MergeScenes
                (&this->mScene,local_178,&local_1d8,(this->configSpeedFlag ^ 1) << 4 | 0xb);
      paVar9 = this->mScene->mRootNode;
      (paVar9->mTransformation).a1 = 1.0;
      (paVar9->mTransformation).a2 = 0.0;
      (paVar9->mTransformation).a3 = 0.0;
      (paVar9->mTransformation).a4 = 0.0;
      (paVar9->mTransformation).b1 = 0.0;
      (paVar9->mTransformation).b2 = 0.0;
      (paVar9->mTransformation).b3 = 1.0;
      (paVar9->mTransformation).b4 = 0.0;
      (paVar9->mTransformation).c1 = 0.0;
      (paVar9->mTransformation).c2 = -1.0;
      (paVar9->mTransformation).c3 = 0.0;
      (paVar9->mTransformation).c4 = 0.0;
      (paVar9->mTransformation).d1 = 0.0;
      (paVar9->mTransformation).d2 = 0.0;
      (paVar9->mTransformation).d3 = 0.0;
      (paVar9->mTransformation).d4 = 1.0;
      bVar5 = false;
    }
    BatchLoader::~BatchLoader(&local_200);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::~_Rb_tree(&local_c0);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *)local_f0);
    if (local_1d8.
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    bVar13 = true;
    if (!bVar5) goto LAB_0045f35a;
  }
  bVar13 = false;
LAB_0045f35a:
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  return bVar13;
}

Assistant:

bool MD3Importer::ReadMultipartFile()
{
    // check whether the file name contains a common postfix, e.g lower_2.md3
    std::string::size_type s = filename.find_last_of('_'), t = filename.find_last_of('.');

    if (t == std::string::npos)
        t = filename.size();
    if (s == std::string::npos)
        s = t;

    const std::string mod_filename = filename.substr(0,s);
    const std::string suffix = filename.substr(s,t-s);

    if (mod_filename == "lower" || mod_filename == "upper" || mod_filename == "head"){
        const std::string lower = path + "lower" + suffix + ".md3";
        const std::string upper = path + "upper" + suffix + ".md3";
        const std::string head  = path + "head"  + suffix + ".md3";

        aiScene* scene_upper = NULL;
        aiScene* scene_lower = NULL;
        aiScene* scene_head = NULL;
        std::string failure;

        aiNode* tag_torso, *tag_head;
        std::vector<AttachmentInfo> attach;

        ASSIMP_LOG_INFO("Multi part MD3 player model: lower, upper and head parts are joined");

        // ensure we won't try to load ourselves recursively
        BatchLoader::PropertyMap props;
        SetGenericProperty( props.ints, AI_CONFIG_IMPORT_MD3_HANDLE_MULTIPART, 0);

        // now read these three files
        BatchLoader batch(mIOHandler);
        const unsigned int _lower = batch.AddLoadRequest(lower,0,&props);
        const unsigned int _upper = batch.AddLoadRequest(upper,0,&props);
        const unsigned int _head  = batch.AddLoadRequest(head,0,&props);
        batch.LoadAll();

        // now construct a dummy scene to place these three parts in
        aiScene* master   = new aiScene();
        aiNode* nd = master->mRootNode = new aiNode();
        nd->mName.Set("<MD3_Player>");

        // ... and get them. We need all of them.
        scene_lower = batch.GetImport(_lower);
        if (!scene_lower) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, lower.md3 fails to load");
            failure = "lower";
            goto error_cleanup;
        }

        scene_upper = batch.GetImport(_upper);
        if (!scene_upper) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, upper.md3 fails to load");
            failure = "upper";
            goto error_cleanup;
        }

        scene_head  = batch.GetImport(_head);
        if (!scene_head) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, head.md3 fails to load");
            failure = "head";
            goto error_cleanup;
        }

        // build attachment infos. search for typical Q3 tags

        // original root
        scene_lower->mRootNode->mName.Set("lower");
        attach.push_back(AttachmentInfo(scene_lower, nd));

        // tag_torso
        tag_torso = scene_lower->mRootNode->FindNode("tag_torso");
        if (!tag_torso) {
            ASSIMP_LOG_ERROR("M3D: Failed to find attachment tag for multi part model: tag_torso expected");
            goto error_cleanup;
        }
        scene_upper->mRootNode->mName.Set("upper");
        attach.push_back(AttachmentInfo(scene_upper,tag_torso));

        // tag_head
        tag_head = scene_upper->mRootNode->FindNode("tag_head");
        if (!tag_head) {
            ASSIMP_LOG_ERROR( "M3D: Failed to find attachment tag for multi part model: tag_head expected");
            goto error_cleanup;
        }
        scene_head->mRootNode->mName.Set("head");
        attach.push_back(AttachmentInfo(scene_head,tag_head));

        // Remove tag_head and tag_torso from all other model parts ...
        // this ensures (together with AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY)
        // that tag_torso/tag_head is also the name of the (unique) output node
        RemoveSingleNodeFromList (scene_upper->mRootNode->FindNode("tag_torso"));
        RemoveSingleNodeFromList (scene_head-> mRootNode->FindNode("tag_head" ));

        // Undo the rotations which we applied to the coordinate systems. We're
        // working in global Quake space here
        scene_head->mRootNode->mTransformation  = aiMatrix4x4();
        scene_lower->mRootNode->mTransformation = aiMatrix4x4();
        scene_upper->mRootNode->mTransformation = aiMatrix4x4();

        // and merge the scenes
        SceneCombiner::MergeScenes(&mScene,master, attach,
            AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES          |
            AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES       |
            AI_INT_MERGE_SCENE_RESOLVE_CROSS_ATTACHMENTS |
            (!configSpeedFlag ? AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY : 0));

        // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
        mScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
            0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);

        return true;

error_cleanup:
        delete scene_upper;
        delete scene_lower;
        delete scene_head;
        delete master;

        if (failure == mod_filename) {
            throw DeadlyImportError("MD3: failure to read multipart host file");
        }
    }
    return false;
}